

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O0

void __thiscall List<String>::~List(List<String> *this)

{
  ItemBlock *pIVar1;
  ItemBlock *next;
  ItemBlock *i_1;
  Item *end;
  Item *i;
  List<String> *this_local;
  
  for (end = (this->_begin).item; end != &this->endItem; end = end->next) {
    Item::~Item(end);
  }
  pIVar1 = this->blocks;
  while (next = pIVar1, next != (ItemBlock *)0x0) {
    pIVar1 = next->next;
    if (next != (ItemBlock *)0x0) {
      operator_delete__(next);
    }
  }
  Item::~Item(&this->endItem);
  return;
}

Assistant:

~List()
  {
    for(Item* i = _begin.item, * end = &endItem; i != end; i = i->next)
      i->~Item();
    for(ItemBlock* i = blocks, * next; i; i = next)
    {
      next = i->next;
      delete[] (char*)i;
    }
  }